

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O2

void undo_perm64(uchar *mat,int *P,int n)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int c;
  ulong uVar10;
  
  uVar1 = n / 0x40;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  lVar2 = (long)(int)uVar1;
  lVar3 = (long)n;
  puVar6 = mat + (lVar3 + -1) * lVar2 * 8;
  while (0 < lVar3) {
    lVar3 = lVar3 + -1;
    puVar7 = mat;
    for (uVar5 = 0; uVar5 != (uint)n; uVar5 = uVar5 + 1) {
      uVar1 = P[lVar3];
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        uVar8 = *(undefined8 *)(puVar6 + uVar10 * 8);
        uVar9 = *(undefined8 *)(puVar7 + uVar10 * 8);
        if (uVar5 != uVar1) {
          uVar9 = uVar8;
        }
        *(undefined8 *)(puVar6 + uVar10 * 8) = uVar9;
        if (uVar5 != uVar1) {
          uVar8 = *(undefined8 *)(puVar7 + uVar10 * 8);
        }
        *(undefined8 *)(puVar7 + uVar10 * 8) = uVar8;
      }
      puVar7 = puVar7 + lVar2 * 8;
    }
    puVar6 = puVar6 + lVar2 * -8;
  }
  return;
}

Assistant:

void undo_perm64(unsigned char *mat, int *P, int n)
{
  uint64_t mask_cpy;
  uint64_t tmp;
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int i = n-1; i >= 0; i--)
  {
    for(int j = 0; j < n; j++)
    {
      mask_cpy = (j == P[i]);
      mask_cpy = -mask_cpy;

      for(int c = 0; c < n/64; c++)
      {
        tmp = mat_64_ptr[(n/64)*i + c];
        mat_64_ptr[(n/64)*i + c] = (mat_64_ptr[(n/64)*i + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*j + c] & mask_cpy);
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (tmp & mask_cpy);
      }
    }
  }
}